

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_0::ShardedLRUCache::Release(ShardedLRUCache *this,Handle *handle)

{
  uint32_t uVar1;
  LRUHandle *h;
  Handle *handle_local;
  ShardedLRUCache *this_local;
  
  uVar1 = Shard(*(uint32_t *)(handle + 0x40));
  LRUCache::Release(this->shard_ + uVar1,handle);
  return;
}

Assistant:

void Release(Handle* handle) override {
    LRUHandle* h = reinterpret_cast<LRUHandle*>(handle);
    shard_[Shard(h->hash)].Release(handle);
  }